

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void ConnectSolution(int64_t cindex,TPZCompMesh *cmesh,TPZFMatrix<double> *glob,TPZVec<double> *sol)

{
  int iVar1;
  int iVar2;
  TPZConnect *this;
  int64_t row;
  double *pdVar3;
  TPZFMatrix<double> *in_RCX;
  TPZCompMesh *in_RSI;
  int64_t i;
  int position;
  int blsize;
  int64_t seqnum;
  int in_stack_ffffffffffffffbc;
  TPZBlock *in_stack_ffffffffffffffc0;
  double dVar4;
  long local_38;
  int64_t in_stack_ffffffffffffffd8;
  
  TPZCompMesh::ConnectVec(in_RSI);
  this = TPZChunkVector<TPZConnect,_10>::operator[]
                   ((TPZChunkVector<TPZConnect,_10> *)in_RCX,in_stack_ffffffffffffffd8);
  row = TPZConnect::SequenceNumber(this);
  TPZCompMesh::Block(in_RSI);
  iVar1 = TPZBlock::Size(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  TPZCompMesh::Block(in_RSI);
  iVar2 = TPZBlock::Position(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  (*(in_RCX->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[4])
            (in_RCX,(long)iVar1);
  for (local_38 = (long)iVar2; local_38 < iVar2 + iVar1; local_38 = local_38 + 1) {
    pdVar3 = TPZFMatrix<double>::operator()(in_RCX,row,CONCAT44(iVar1,iVar2));
    dVar4 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)in_RCX,local_38 - iVar2);
    *pdVar3 = dVar4;
  }
  return;
}

Assistant:

static void ConnectSolution(int64_t cindex, TPZCompMesh *cmesh, TPZFMatrix<STATE> &glob, TPZVec<STATE> &sol)
{
    int64_t seqnum = cmesh->ConnectVec()[cindex].SequenceNumber();
    int blsize = cmesh->Block().Size(seqnum);
    int position = cmesh->Block().Position(seqnum);
    sol.resize(blsize);
    for (int64_t i=position; i< position+blsize; i++) {
        sol[i-position] = glob(i,0);
    }
}